

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  size_t sVar2;
  char *local_28;
  char *zDir;
  uint j;
  uint i;
  char *zBuf_local;
  int nBuf_local;
  
  local_28 = unixTempFileDir();
  if (local_28 == (char *)0x0) {
    local_28 = ".";
  }
  sVar2 = strlen(local_28);
  if (sVar2 + 0x19 < (ulong)(long)nBuf) {
    do {
      sqlite3_snprintf(nBuf + -0x12,zBuf,"%s/etilqs_",local_28);
      sVar2 = strlen(zBuf);
      zDir._0_4_ = (uint)sVar2;
      sqlite3_randomness(0xf,zBuf + (sVar2 & 0xffffffff));
      for (zDir._4_4_ = 0; zDir._4_4_ < 0xf; zDir._4_4_ = zDir._4_4_ + 1) {
        zBuf[(uint)zDir] =
             "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"
             [(ulong)(byte)zBuf[(uint)zDir] % 0x3e];
        zDir._0_4_ = (uint)zDir + 1;
      }
      zBuf[(uint)zDir] = '\0';
      zBuf[(uint)zDir + 1] = '\0';
      iVar1 = (*aSyscall[2].pCurrent)(zBuf,0);
    } while (iVar1 == 0);
    zBuf_local._4_4_ = 0;
  }
  else {
    zBuf_local._4_4_ = 1;
  }
  return zBuf_local._4_4_;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  static const unsigned char zChars[] =
    "abcdefghijklmnopqrstuvwxyz"
    "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
    "0123456789";
  unsigned int i, j;
  const char *zDir;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. 
  */
  SimulateIOError( return SQLITE_IOERR );

  zDir = unixTempFileDir();
  if( zDir==0 ) zDir = ".";

  /* Check that the output buffer is large enough for the temporary file 
  ** name. If it is not, return SQLITE_ERROR.
  */
  if( (strlen(zDir) + strlen(SQLITE_TEMP_FILE_PREFIX) + 18) >= (size_t)nBuf ){
    return SQLITE_ERROR;
  }

  do{
    sqlite3_snprintf(nBuf-18, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX, zDir);
    j = (int)strlen(zBuf);
    sqlite3_randomness(15, &zBuf[j]);
    for(i=0; i<15; i++, j++){
      zBuf[j] = (char)zChars[ ((unsigned char)zBuf[j])%(sizeof(zChars)-1) ];
    }
    zBuf[j] = 0;
    zBuf[j+1] = 0;
  }while( osAccess(zBuf,0)==0 );
  return SQLITE_OK;
}